

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlmembuf.c
# Opt level: O1

int ixml_membuf_insert(ixml_membuf *m,void *buf,size_t buf_len,size_t index)

{
  int iVar1;
  size_t sVar2;
  
  if (m != (ixml_membuf *)0x0) {
    iVar1 = 1;
    if ((index <= m->length) && (iVar1 = 0, buf_len != 0 && buf != (void *)0x0)) {
      iVar1 = ixml_membuf_set_size(m,m->length + buf_len);
      if (iVar1 == 0) {
        memmove(m->buf + index + buf_len,m->buf + index,m->length - index);
        memcpy(m->buf + index,buf,buf_len);
        sVar2 = buf_len + m->length;
        m->length = sVar2;
        m->buf[sVar2] = '\0';
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  __assert_fail("m != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlmembuf.c"
                ,0xbb,"int ixml_membuf_insert(ixml_membuf *, const void *, size_t, size_t)");
}

Assistant:

int ixml_membuf_insert(
	/*! [in,out] The memory buffer */
	ixml_membuf *m,
	/*! [in] The buffer to insert */
	const void *buf,
	/*! [in] The length of the buffer */
	size_t buf_len,
	/*! [in] Position where to insert the buffer */
	size_t index)
{
	int return_code = 0;

	assert(m != NULL);

	if (index > m->length) {
		return IXML_INDEX_SIZE_ERR;
	}

	if (buf == NULL || buf_len == (size_t)0) {
		return 0;
	}
	/* alloc mem */
	return_code = ixml_membuf_set_size(m, m->length + buf_len);
	if (return_code != 0) {
		return return_code;
	}
	/* insert data */
	/* move data to right of insertion point */
	memmove(m->buf + index + buf_len, m->buf + index, m->length - index);
	memcpy(m->buf + index, buf, buf_len);
	m->length += buf_len;
	/* Null terminate */
	m->buf[m->length] = 0;

	return 0;
}